

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O0

void __thiscall helics::FilterFederate::processFilterReturn(FilterFederate *this,ActionMessage *cmd)

{
  bool bVar1;
  bool bVar2;
  action_t aVar3;
  uint32_t uVar4;
  FilterCoordinator *this_00;
  function<void_(helics::ActionMessage_&)> *pfVar5;
  reference ppFVar6;
  size_type sVar7;
  ActionMessage *in_RSI;
  HandleManager *in_RDI;
  pair<helics::ActionMessage_&,_bool> pVar8;
  uint32_t in_stack_00000024;
  undefined4 in_stack_00000028;
  uint32_t in_stack_0000002c;
  undefined4 in_stack_00000030;
  GlobalFederateId in_stack_00000034;
  Time in_stack_00000038;
  GlobalFederateId in_stack_00000044;
  pair<helics::ActionMessage_&,_bool> press;
  FilterInfo *filt;
  size_t ii;
  bool needToSendMessage;
  FilterCoordinator *filtFunc;
  BaseType fid_index;
  GlobalFederateId fid;
  uint32_t mid;
  BasicHandleInfo *handle;
  FilterInfo *in_stack_00000310;
  ActionMessage *in_stack_00000318;
  FilterFederate *in_stack_00000320;
  ActionMessage *in_stack_ffffffffffffff38;
  function<void_(helics::ActionMessage_&)> *in_stack_ffffffffffffff40;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffff48;
  function<void_(helics::ActionMessage_&)> *pfVar9;
  InterfaceHandle in_stack_ffffffffffffff5c;
  key_type_conflict1 *in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff81;
  undefined1 in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff91;
  undefined8 in_stack_ffffffffffffff98;
  InterfaceHandle handle_00;
  function<void_(helics::ActionMessage_&)> *local_60;
  _Self local_40;
  uint32_t local_34;
  _Self local_30;
  BaseType local_28;
  GlobalFederateId local_24;
  uint32_t local_20;
  BaseType local_1c;
  BasicHandleInfo *local_18;
  ActionMessage *local_10;
  
  handle_00.hid = (BaseType)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  local_1c = (in_RSI->dest_handle).hid;
  local_10 = in_RSI;
  local_18 = HandleManager::getInterfaceHandle
                       (in_RDI,in_stack_ffffffffffffff5c,
                        (InterfaceType)((ulong)in_stack_ffffffffffffff48 >> 0x38));
  if (local_18 != (BasicHandleInfo *)0x0) {
    local_20 = local_10->sequenceID;
    local_24 = BasicHandleInfo::getFederateId(local_18);
    local_28 = GlobalFederateId::baseValue(&local_24);
    std::
    map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ::operator[]((map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                  *)CONCAT71(in_stack_ffffffffffffff81,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
    local_34 = local_20;
    local_30._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::find
                   (in_stack_ffffffffffffff48,(key_type_conflict1 *)in_stack_ffffffffffffff40);
    std::
    map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ::operator[]((map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                  *)CONCAT71(in_stack_ffffffffffffff81,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
    local_40._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffff38);
    bVar1 = std::operator==(&local_30,&local_40);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      aVar3 = ActionMessage::action(local_10);
      if (aVar3 == cmd_null_message) {
        acceptProcessReturn((FilterFederate *)CONCAT44(in_stack_0000002c,in_stack_00000028),
                            in_stack_00000034,in_stack_00000024);
      }
      else {
        BasicHandleInfo::getInterfaceHandle(local_18);
        this_00 = getFilterCoordinator
                            ((FilterFederate *)
                             CONCAT71(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90),handle_00
                            );
        ActionMessage::setAction(local_10,cmd_send_message);
        bVar1 = true;
        local_60 = (function<void_(helics::ActionMessage_&)> *)(ulong)local_10->counter;
        do {
          local_60 = (function<void_(helics::ActionMessage_&)> *)
                     ((long)&(local_60->super__Function_base)._M_functor._M_unused + 1);
          pfVar9 = local_60;
          pfVar5 = (function<void_(helics::ActionMessage_&)> *)
                   std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::size
                             (&this_00->sourceFilters);
          if (pfVar5 <= pfVar9) goto LAB_0059e1b2;
          ppFVar6 = std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::
                    operator[](&this_00->sourceFilters,(size_type)local_60);
          bVar2 = checkActionFlag<helics::FilterInfo,helics::ConnectionFlags>
                            (*ppFVar6,disconnected_flag);
        } while ((bVar2) ||
                (pVar8 = executeFilter(in_stack_00000320,in_stack_00000318,in_stack_00000310),
                ((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0));
        aVar3 = ActionMessage::action(local_10);
        if (aVar3 == cmd_ignore) {
          bVar1 = false;
        }
        else {
          in_stack_ffffffffffffff40 = local_60;
          sVar7 = std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::size
                            (&this_00->sourceFilters);
          if (in_stack_ffffffffffffff40 < (function<void_(helics::ActionMessage_&)> *)(sVar7 - 1)) {
            local_10->counter = (uint16_t)local_60;
            ActionMessage::setAction(local_10,cmd_send_for_filter_return);
            uVar4 = std::__atomic_base<int>::operator++
                              ((__atomic_base<int> *)&in_RDI[2].endpoints._M_h._M_single_bucket,0);
            local_10->sequenceID = uVar4;
            ActionMessage::setSource(local_10,local_18->handle);
            BasicHandleInfo::getFederateId(local_18);
            generateProcessMarker
                      ((FilterFederate *)CONCAT44(in_stack_00000034.gid,in_stack_00000030),
                       in_stack_00000044,in_stack_0000002c,in_stack_00000038);
          }
          else {
            ActionMessage::setAction(local_10,cmd_send_for_filter);
          }
        }
LAB_0059e1b2:
        acceptProcessReturn((FilterFederate *)CONCAT44(in_stack_0000002c,in_stack_00000028),
                            in_stack_00000034,in_stack_00000024);
        if (bVar1) {
          std::function<void_(helics::ActionMessage_&)>::operator()
                    (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        }
      }
    }
  }
  return;
}

Assistant:

void FilterFederate::processFilterReturn(ActionMessage& cmd)
{
    auto* handle = mHandles->getInterfaceHandle(cmd.dest_handle, InterfaceType::ENDPOINT);
    if (handle == nullptr) {
        return;
    }

    auto mid = cmd.sequenceID;
    auto fid = handle->getFederateId();
    auto fid_index = fid.baseValue();

    if (ongoingFilterProcesses[fid_index].find(mid) != ongoingFilterProcesses[fid_index].end()) {
        if (cmd.action() == CMD_NULL_MESSAGE) {
            acceptProcessReturn(fid, mid);
            return;
        }
        auto* filtFunc = getFilterCoordinator(handle->getInterfaceHandle());
        cmd.setAction(CMD_SEND_MESSAGE);
        bool needToSendMessage{true};
        for (auto ii = static_cast<size_t>(cmd.counter) + 1; ii < filtFunc->sourceFilters.size();
             ++ii) {
            auto* filt = filtFunc->sourceFilters[ii];
            if (checkActionFlag(*filt, disconnected_flag)) {
                continue;
            }

            auto press = executeFilter(cmd, filt);
            if (!press.second) {
                if (cmd.action() == CMD_IGNORE) {
                    needToSendMessage = false;
                    break;
                }

                if (ii < filtFunc->sourceFilters.size() - 1) {
                    cmd.counter = static_cast<uint16_t>(ii);
                    cmd.setAction(CMD_SEND_FOR_FILTER_AND_RETURN);
                    cmd.sequenceID = messageCounter++;
                    cmd.setSource(handle->handle);
                    generateProcessMarker(handle->getFederateId(), cmd.sequenceID, cmd.actionTime);
                } else {
                    cmd.setAction(CMD_SEND_FOR_FILTER);
                }
                break;
            }
        }
        acceptProcessReturn(fid, mid);
        if (needToSendMessage) {
            mDeliverMessage(cmd);
        }
    }
}